

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManagement.h
# Opt level: O2

ObjectBase * __thiscall
chatra::Storage::derefDirect<chatra::ObjectBase>(Storage *this,size_t objectIndex)

{
  ObjectBase *pOVar1;
  undefined8 *puVar2;
  _Deque_iterator<unsigned_long,_const_unsigned_long_&,_const_unsigned_long_*> local_88;
  _Deque_iterator<unsigned_long,_const_unsigned_long_&,_const_unsigned_long_*> local_68;
  _Deque_iterator<unsigned_long,_const_unsigned_long_&,_const_unsigned_long_*> local_48;
  size_t local_28;
  size_t objectIndex_local;
  
  local_28 = objectIndex;
  SpinLock::lock(&this->lockObjects);
  if (objectIndex <
      (ulong)((long)(this->objects).
                    super__Vector_base<chatra::Object_*,_std::allocator<chatra::Object_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->objects).
                    super__Vector_base<chatra::Object_*,_std::allocator<chatra::Object_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3)) {
    local_88._M_cur =
         (this->recycledObjectIndexes).
         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur;
    local_88._M_first =
         (this->recycledObjectIndexes).
         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Deque_impl_data._M_start._M_first;
    local_88._M_last =
         (this->recycledObjectIndexes).
         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Deque_impl_data._M_start._M_last;
    local_88._M_node =
         (this->recycledObjectIndexes).
         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Deque_impl_data._M_start._M_node;
    local_68._M_cur =
         (this->recycledObjectIndexes).
         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Deque_impl_data._M_finish._M_cur;
    local_68._M_first =
         (this->recycledObjectIndexes).
         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Deque_impl_data._M_finish._M_first;
    local_68._M_last =
         (this->recycledObjectIndexes).
         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Deque_impl_data._M_finish._M_last;
    local_68._M_node =
         (this->recycledObjectIndexes).
         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Deque_impl_data._M_finish._M_node;
    std::
    find<std::_Deque_iterator<unsigned_long,unsigned_long_const&,unsigned_long_const*>,unsigned_long>
              (&local_48,&local_88,&local_68,&local_28);
    if (local_48._M_cur ==
        (this->recycledObjectIndexes).
        super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur) {
      pOVar1 = (ObjectBase *)
               (this->objects).
               super__Vector_base<chatra::Object_*,_std::allocator<chatra::Object_*>_>._M_impl.
               super__Vector_impl_data._M_start[local_28];
      (this->lockObjects).flag.super___atomic_flag_base._M_i = false;
      return pOVar1;
    }
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
  puVar2[2] = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  puVar2[1] = puVar2 + 3;
  *(undefined1 *)(puVar2 + 3) = 0;
  *puVar2 = &PTR__NativeException_0023ce78;
  __cxa_throw(puVar2,&IllegalArgumentException::typeinfo,NativeException::~NativeException);
}

Assistant:

Type& Storage::derefDirect(size_t objectIndex) const {
	static_assert(std::is_base_of<Object, Type>::value, "Type should be derived class of Object");
	std::lock_guard<SpinLock> lock0(lockObjects);

	if (objectIndex >= objects.size() ||
			std::find(recycledObjectIndexes.cbegin(), recycledObjectIndexes.cend(), objectIndex) != recycledObjectIndexes.cend())
		throw IllegalArgumentException();

	return *static_cast<Type*>(objects[objectIndex]);
}